

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O3

void __thiscall
JAMA::Eigenvalue<double>::Eigenvalue(Eigenvalue<double> *this,DynamicRectMatrix<double> *A)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  double **ppdVar6;
  double **ppdVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int j;
  allocator_type local_69;
  vector<double,_std::allocator<double>_> local_68;
  DynamicRectMatrix<double> local_48;
  DynamicRectMatrix<double> local_38;
  
  (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H).data_ = (double **)0x0;
  (this->H).nrow_ = 0;
  (this->H).ncol_ = 0;
  (this->V).data_ = (double **)0x0;
  (this->V).nrow_ = 0;
  (this->V).ncol_ = 0;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = A->ncol_;
  this->n = uVar3;
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)&local_68,uVar3,uVar3);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_38,&this->V);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_38);
  OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_68);
  std::vector<double,_std::allocator<double>_>::vector(&local_68,(long)this->n,&local_69);
  pdVar4 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar4 != (pointer)0x0) &&
     (operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4),
     (double **)
     local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (double **)0x0)) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_68,(long)this->n,&local_69);
  pdVar4 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar4 != (pointer)0x0) &&
     (operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4),
     (double **)
     local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (double **)0x0)) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this->issymmetric = 1;
  uVar3 = this->n;
  uVar12 = (ulong)(int)uVar3;
  if (0 < (long)uVar12) {
    uVar11 = 0;
    do {
      uVar14 = 1;
      while( true ) {
        dVar1 = A->data_[uVar14 - 1][uVar11];
        dVar2 = A->data_[uVar11][uVar14 - 1];
        if (uVar12 <= uVar14) break;
        uVar14 = uVar14 + 1;
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      }
      uVar11 = uVar11 + 1;
      if (uVar12 <= uVar11) goto LAB_00221891;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_00221891;
    } while( true );
  }
LAB_002218dd:
  tred2(this);
  tql2(this);
  return;
LAB_00221891:
  this->issymmetric = -(uint)(dVar1 == dVar2) & 1;
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
              ((DynamicRectMatrix<double> *)&local_68,uVar3,uVar3);
    OpenMD::DynamicRectMatrix<double>::operator=(&local_48,&this->H);
    OpenMD::DynamicRectMatrix<double>::deallocate(&local_48);
    OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_68);
    std::vector<double,_std::allocator<double>_>::vector(&local_68,(long)this->n,&local_69);
    pdVar4 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((pdVar4 != (pointer)0x0) &&
       (operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4),
       (double **)
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start != (double **)0x0)) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar10 = (long)this->n;
    if (0 < lVar10) {
      ppdVar6 = A->data_;
      ppdVar7 = (this->H).data_;
      lVar13 = 0;
      do {
        lVar15 = 0;
        do {
          ppdVar7[lVar15][lVar13] = ppdVar6[lVar15][lVar13];
          lVar15 = lVar15 + 1;
        } while (lVar10 != lVar15);
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar10);
    }
    orthes(this);
    hqr2(this);
    return;
  }
  ppdVar6 = A->data_;
  ppdVar7 = (this->V).data_;
  uVar11 = 0;
  do {
    pdVar8 = ppdVar6[uVar11];
    pdVar9 = ppdVar7[uVar11];
    uVar14 = 0;
    do {
      pdVar9[uVar14] = pdVar8[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar12);
  goto LAB_002218dd;
}

Assistant:

Eigenvalue(const DynamicRectMatrix<Real>& A) {
      n = A.getNCol();
      V = DynamicRectMatrix<Real>(n, n);
      d = DynamicVector<Real>(n);
      e = DynamicVector<Real>(n);

      issymmetric = 1;
      for (int j = 0; (j < n) && issymmetric; j++) {
        for (int i = 0; (i < n) && issymmetric; i++) {
          issymmetric = (A(i, j) == A(j, i));
        }
      }

      if (issymmetric) {
        for (int i = 0; i < n; i++) {
          for (int j = 0; j < n; j++) {
            V(i, j) = A(i, j);
          }
        }

        // Tridiagonalize.
        tred2();

        // Diagonalize.
        tql2();

      } else {
        H   = DynamicRectMatrix<Real>(n, n);
        ort = DynamicVector<Real>(n);

        for (int j = 0; j < n; j++) {
          for (int i = 0; i < n; i++) {
            H(i, j) = A(i, j);
          }
        }

        // Reduce to Hessenberg form.
        orthes();

        // Reduce Hessenberg to real Schur form.
        hqr2();
      }
    }